

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  char *pcVar9;
  buffer_appender<char> bVar10;
  uint uVar11;
  buffer<char> *buf;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [8];
  undefined1 auVar15 [8];
  ulong uVar16;
  int iVar17;
  _Alloc_hider _Var18;
  uint uVar19;
  char *pcVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong size;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_2b0;
  char acStack_98 [8];
  char digits [40];
  undefined1 local_60 [8];
  string groups;
  
  grouping_impl<char>((string *)local_60,(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 != '\0') {
      uVar11 = this->abs_value;
      uVar13 = 0x1f;
      if ((uVar11 | 1) != 0) {
        for (; (uVar11 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar4 = *(ushort *)(basic_data<void>::bsr2log10 + (ulong)uVar13 * 2);
      uVar22 = (uint)uVar4 -
               (uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                        (ulong)uVar4 * 4));
      iVar21 = -(uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                         (ulong)uVar4 * 4));
      pcVar9 = (char *)((long)local_60 + (long)groups._M_dataplus._M_p);
      auVar14 = local_60;
      uVar13 = uVar22;
      uVar8 = uVar22;
      if (groups._M_dataplus._M_p != (pointer)0x0) {
        auVar15 = local_60;
        _Var18 = groups._M_dataplus;
        uVar12 = uVar22;
        do {
          cVar2 = *(char *)auVar15;
          uVar19 = uVar8 - (int)cVar2;
          auVar14 = auVar15;
          uVar13 = uVar12;
          if ((uVar19 == 0 || (int)uVar8 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar12 = uVar12 + 1;
          auVar15 = (undefined1  [8])((long)auVar15 + 1);
          _Var18._M_p = _Var18._M_p + -1;
          auVar14 = (undefined1  [8])pcVar9;
          uVar13 = (int)groups._M_dataplus._M_p + iVar21 + (uint)uVar4;
          uVar8 = uVar19;
        } while (_Var18._M_p != (pointer)0x0);
      }
      if (auVar14 == (undefined1  [8])pcVar9) {
        uVar13 = uVar13 + (int)(uVar8 - 1) / (int)pcVar9[-1];
      }
      pcVar9 = acStack_98 + (int)uVar22;
      uVar8 = uVar11;
      if (99 < uVar11) {
        do {
          uVar8 = uVar11 / 100;
          *(undefined2 *)(pcVar9 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar11 % 100) * 2);
          pcVar9 = pcVar9 + -2;
          bVar6 = 9999 < uVar11;
          uVar11 = uVar11 / 100;
        } while (bVar6);
      }
      if (uVar8 < 10) {
        pcVar9[-1] = (byte)uVar8 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar9 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar8 * 2);
      }
      local_2b0.super_buffer<char>.ptr_ = local_2b0.store_;
      local_2b0.super_buffer<char>.size_ = 0;
      groups.field_2._8_8_ = &PTR_grow_002b8bb8;
      local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002b8bb8;
      local_2b0.super_buffer<char>.capacity_ = 500;
      uVar13 = uVar13 + this->prefix_size;
      if (-1 < (int)uVar13) {
        size = (ulong)uVar13;
        if (500 < uVar13) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_2b0,size);
        }
        pcVar9 = local_2b0.super_buffer<char>.ptr_;
        local_2b0.super_buffer<char>.size_ = local_2b0.super_buffer<char>.capacity_;
        if (size <= local_2b0.super_buffer<char>.capacity_) {
          local_2b0.super_buffer<char>.size_ = size;
        }
        pcVar20 = local_2b0.super_buffer<char>.ptr_ + size;
        if (0 < (int)uVar22) {
          uVar16 = (ulong)uVar22;
          iVar17 = iVar21 + (uint)uVar4 + 1;
          iVar21 = 0;
          auVar14 = local_60;
          do {
            uVar16 = uVar16 - 1;
            pcVar1 = pcVar20 + -1;
            pcVar20[-1] = acStack_98[uVar16 & 0xffffffff];
            cVar2 = *(char *)auVar14;
            if ('\0' < cVar2) {
              iVar21 = iVar21 + 1;
              if ((cVar2 != '\x7f') && (iVar21 % (int)cVar2 == 0)) {
                if ((char *)((long)auVar14 + 1) !=
                    (char *)((long)local_60 + (long)groups._M_dataplus._M_p)) {
                  iVar21 = 0;
                  auVar14 = (undefined1  [8])((long)auVar14 + 1);
                }
                pcVar20[-2] = cVar7;
                pcVar1 = pcVar20 + -2;
              }
            }
            pcVar20 = pcVar1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        if (this->prefix_size != 0) {
          pcVar20[-1] = 0x2d;
        }
        pbVar5 = this->specs;
        uVar16 = (ulong)pbVar5->width;
        if (-1 < (long)uVar16) {
          uVar23 = 0;
          if (size <= uVar16) {
            uVar23 = uVar16 - size;
          }
          bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + size + (pbVar5->fill).size_ * uVar23) {
            (*(code *)**(undefined8 **)
                        bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar16 = uVar23 >> (bVar3 & 0x3f);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar16,&pbVar5->fill);
          bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar9,pcVar9 + size,bVar10);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar10,uVar23 - uVar16,&pbVar5->fill);
          (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)groups.field_2._8_8_;
          if (local_2b0.super_buffer<char>.ptr_ != local_2b0.store_) {
            operator_delete(local_2b0.super_buffer<char>.ptr_,local_2b0.super_buffer<char>.capacity_
                           );
          }
          goto LAB_00236b81;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
    on_dec(this);
  }
LAB_00236b81:
  if (local_60 != (undefined1  [8])&groups._M_string_length) {
    operator_delete((void *)local_60,groups._M_string_length + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }